

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::ExtensionRangeOptions::ByteSizeLong(ExtensionRangeOptions *this)

{
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *this_00;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_01;
  uint uVar1;
  size_t sVar2;
  void **ppvVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  
  sVar2 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  lVar8 = (long)*(int *)((long)&this->field_0 + 0x28) + sVar2;
  this_00 = &(this->field_0)._impl_.declaration_;
  ppvVar3 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar4 = RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::end(this_00);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    sVar2 = internal::WireFormatLite::
            MessageSize<google::protobuf::ExtensionRangeOptions_Declaration>
                      ((ExtensionRangeOptions_Declaration *)*ppvVar3);
    lVar8 = lVar8 + sVar2;
  }
  sVar2 = lVar8 + (long)*(int *)((long)&this->field_0 + 0x40) * 2;
  this_01 = &(this->field_0)._impl_.uninterpreted_option_;
  ppvVar3 = internal::RepeatedPtrFieldBase::elements(&this_01->super_RepeatedPtrFieldBase);
  cVar5 = RepeatedPtrField<google::protobuf::UninterpretedOption>::end(this_01);
  for (; ppvVar3 != cVar5.it_; ppvVar3 = ppvVar3 + 1) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>
                      ((UninterpretedOption *)*ppvVar3);
    sVar2 = sVar2 + sVar6;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::FeatureSet>
                        ((this->field_0)._impl_.features_);
      sVar2 = sVar2 + sVar6 + 2;
    }
    if ((uVar1 & 2) != 0) {
      uVar7 = (long)(this->field_0)._impl_.verification_ | 1;
      lVar8 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      sVar2 = sVar2 + ((int)lVar8 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar2 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t ExtensionRangeOptions::ByteSizeLong() const {
  const ExtensionRangeOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.ExtensionRangeOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.ExtensionRangeOptions.Declaration declaration = 2 [retention = RETENTION_SOURCE];
    {
      total_size += 1UL * this_._internal_declaration_size();
      for (const auto& msg : this_._internal_declaration()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional .google.protobuf.FeatureSet features = 50;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
    // optional .google.protobuf.ExtensionRangeOptions.VerificationState verification = 3 [default = UNVERIFIED, retention = RETENTION_SOURCE];
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_verification());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}